

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void H3_compute(picnic_instance_t *pp,uint8_t *hash,uint8_t *ch)

{
  byte bVar1;
  ushort uVar2;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  uint8_t twobits;
  hash_context ctx;
  uint bit_idx;
  uint8_t *eof;
  uint digest_size_bits;
  uint digest_size;
  undefined7 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffeef;
  hash_context *in_stack_fffffffffffffef0;
  uint local_2c;
  byte *local_18;
  
  bVar1 = *(byte *)(in_RDI + 6);
  uVar2 = *(ushort *)(in_RDI + 4);
  local_2c = 0;
  local_18 = in_RDX;
  while (local_18 < in_RDX + (int)(uint)uVar2) {
    if ((uint)bVar1 << 3 <= local_2c) {
      hash_init_prefix(in_stack_fffffffffffffef0,
                       CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),'\0');
      hash_update(in_stack_fffffffffffffef0,
                  (uint8_t *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),0x141539)
      ;
      hash_final((hash_context *)0x141543);
      hash_squeeze(in_stack_fffffffffffffef0,
                   (uint8_t *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),0x14155e
                  );
      local_2c = 0;
    }
    in_stack_fffffffffffffeef =
         (byte)((int)(uint)*(byte *)(in_RSI + (ulong)(local_2c >> 3)) >>
               (6 - ((byte)local_2c & 7) & 0x1f)) & 3;
    if (in_stack_fffffffffffffeef != 3) {
      *local_18 = in_stack_fffffffffffffeef;
      local_18 = local_18 + 1;
    }
    local_2c = local_2c + 2;
  }
  return;
}

Assistant:

static void H3_compute(const picnic_instance_t* pp, uint8_t* hash, uint8_t* ch) {
  const unsigned int digest_size      = pp->digest_size;
  const unsigned int digest_size_bits = digest_size << 3;

  // Pick bits from hash
  uint8_t* eof         = ch + pp->num_rounds;
  unsigned int bit_idx = 0;
  while (ch < eof) {
    if (bit_idx >= digest_size_bits) {
      hash_context ctx;
      hash_init_prefix(&ctx, digest_size, HASH_PREFIX_1);
      hash_update(&ctx, hash, digest_size);
      hash_final(&ctx);
      hash_squeeze(&ctx, hash, digest_size);
      hash_clear(&ctx);
      bit_idx = 0;
    }

    const uint8_t twobits = (hash[bit_idx >> 3] >> ((6 - (bit_idx & 0x7)))) & 0x3;
    if (twobits != 0x3) {
      *ch++ = twobits;
    }
    bit_idx += 2;
  }
}